

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Joytime::Controller::readSPIFlash
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Controller *this,int32_t address,uint8_t length)

{
  initializer_list<unsigned_char> __l;
  size_type sVar1;
  allocator<unsigned_char> local_b1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a0;
  undefined4 local_94;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  undefined1 local_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> res;
  allocator<unsigned_char> local_4e;
  uchar local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  uint8_t local_49;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  uint8_t length_local;
  int32_t address_local;
  Controller *this_local;
  
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = (uchar)address;
  local_4d = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_1_;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = (undefined1)((uint)address >> 8);
  local_4c = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._5_1_;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = (undefined1)((uint)address >> 0x10);
  local_4b = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._6_1_;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = (undefined1)((uint)address >> 0x18);
  local_4a = buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._7_1_;
  local_48 = &local_4d;
  local_40 = 5;
  local_49 = length;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = length;
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = address;
  std::allocator<unsigned_char>::allocator(&local_4e);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,__l,&local_4e);
  std::allocator<unsigned_char>::~allocator(&local_4e);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_90,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  sendSubcommand((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,this,
                 RumbleAndSubcommand,ReadSPIFlash,&local_90);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_90);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  if (sVar1 < 0x14) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  }
  else {
    local_a8._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    local_a0 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_a8,0x14);
    local_b0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
    std::allocator<unsigned_char>::allocator(&local_b1);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               local_a0,local_b0,&local_b1);
    std::allocator<unsigned_char>::~allocator(&local_b1);
  }
  local_94 = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> Joytime::Controller::readSPIFlash(int32_t address, uint8_t length) {
  std::vector<uint8_t> buf = {
    (uint8_t)((address) & 0xff),
    (uint8_t)((address >> 8) & 0xff),
    (uint8_t)((address >> 16) & 0xff),
    (uint8_t)((address >> 24) & 0xff),
    length
  };

  std::vector<uint8_t> res = sendSubcommand(Joytime::ControllerCommand::RumbleAndSubcommand, Joytime::ControllerSubcommand::ReadSPIFlash, buf);
  if (res.size() < 20) return std::vector<uint8_t>();

  // offset 20, explained:
  // 15 - subcommand response data starts at 15
  // 4  - 4 bytes for the address read
  // 1  - 1 byte for length
  return std::vector<uint8_t>(res.begin() + 20, res.end());
}